

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

s3wid_t dict_add_word(dict_t *d,char *word,s3cipid_t *p,int32 np)

{
  int32 iVar1;
  void *pvVar2;
  char *pcVar3;
  int local_4c;
  char *pcStack_48;
  int32 w;
  char *wword;
  undefined8 *puStack_38;
  s3wid_t newwid;
  dictword_t *wordp;
  int32 len;
  int32 np_local;
  s3cipid_t *p_local;
  char *word_local;
  dict_t *d_local;
  
  wordp._4_4_ = np;
  _len = p;
  p_local = (s3cipid_t *)word;
  word_local = (char *)d;
  if (d->max_words <= d->n_word) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",
            0x56,"Reallocating to %d KiB for word entries\n",
            (ulong)((long)(d->max_words + 0x1000) << 5) >> 10);
    pvVar2 = __ckd_realloc__(*(void **)(word_local + 0x10),
                             (long)(*(int *)(word_local + 0x20) + 0x1000) << 5,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                             ,0x5a);
    *(void **)(word_local + 0x10) = pvVar2;
    *(int *)(word_local + 0x20) = *(int *)(word_local + 0x20) + 0x1000;
  }
  puStack_38 = (undefined8 *)
               (*(long *)(word_local + 0x10) + (long)*(int *)(word_local + 0x24) * 0x20);
  pcVar3 = __ckd_salloc__((char *)p_local,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                          ,0x5f);
  *puStack_38 = pcVar3;
  pcStack_48 = __ckd_salloc__((char *)p_local,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                              ,0x62);
  wordp._0_4_ = dict_word2basestr(pcStack_48);
  if ((int32)wordp < 1) {
    *(undefined4 *)((long)puStack_38 + 0x14) = 0xffffffff;
    *(undefined4 *)(puStack_38 + 3) = *(undefined4 *)(word_local + 0x24);
  }
  else {
    iVar1 = hash_table_lookup_int32(*(hash_table_t **)(word_local + 0x18),pcStack_48,&local_4c);
    if (iVar1 < 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
              ,0x68,"Missing base word for: %s\n",p_local);
      ckd_free(pcStack_48);
      ckd_free((void *)*puStack_38);
      *puStack_38 = 0;
      return -1;
    }
    *(int *)(puStack_38 + 3) = local_4c;
    *(undefined4 *)((long)puStack_38 + 0x14) =
         *(undefined4 *)(*(long *)(word_local + 0x10) + (long)local_4c * 0x20 + 0x14);
    *(undefined4 *)(*(long *)(word_local + 0x10) + (long)local_4c * 0x20 + 0x14) =
         *(undefined4 *)(word_local + 0x24);
  }
  ckd_free(pcStack_48);
  pvVar2 = hash_table_enter(*(hash_table_t **)(word_local + 0x18),(char *)*puStack_38,
                            (void *)(long)*(int *)(word_local + 0x24));
  if ((int)pvVar2 == *(int *)(word_local + 0x24)) {
    if ((_len == (s3cipid_t *)0x0) || (wordp._4_4_ < 1)) {
      puStack_38[1] = 0;
      *(undefined4 *)(puStack_38 + 2) = 0;
    }
    else {
      pvVar2 = __ckd_malloc__((long)wordp._4_4_ << 1,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                              ,0x82);
      puStack_38[1] = pvVar2;
      memcpy((void *)puStack_38[1],_len,(long)wordp._4_4_ << 1);
      *(int32 *)(puStack_38 + 2) = wordp._4_4_;
    }
    d_local._4_4_ = *(int *)(word_local + 0x24);
    *(int *)(word_local + 0x24) = d_local._4_4_ + 1;
  }
  else {
    ckd_free((void *)*puStack_38);
    *puStack_38 = 0;
    d_local._4_4_ = -1;
  }
  return d_local._4_4_;
}

Assistant:

s3wid_t
dict_add_word(dict_t * d, char const *word, s3cipid_t const * p, int32 np)
{
    int32 len;
    dictword_t *wordp;
    s3wid_t newwid;
    char *wword;

    if (d->n_word >= d->max_words) {
        E_INFO("Reallocating to %d KiB for word entries\n",
               (d->max_words + S3DICT_INC_SZ) * sizeof(dictword_t) / 1024);
        d->word =
            (dictword_t *) ckd_realloc(d->word,
                                       (d->max_words +
                                        S3DICT_INC_SZ) * sizeof(dictword_t));
        d->max_words = d->max_words + S3DICT_INC_SZ;
    }

    wordp = d->word + d->n_word;
    wordp->word = (char *) ckd_salloc(word);    /* Freed in dict_free */

    /* Determine base/alt wids */
    wword = ckd_salloc(word);
    if ((len = dict_word2basestr(wword)) > 0) {
        int32 w;

        /* Truncated to a baseword string; find its ID */
        if (hash_table_lookup_int32(d->ht, wword, &w) < 0) {
            E_ERROR("Missing base word for: %s\n", word);
            ckd_free(wword);
            ckd_free(wordp->word);
            wordp->word = NULL;
            return BAD_S3WID;
        }

        /* Link into alt list */
        wordp->basewid = w;
        wordp->alt = d->word[w].alt;
        d->word[w].alt = d->n_word;
    } else {
        wordp->alt = BAD_S3WID;
        wordp->basewid = d->n_word;
    }
    ckd_free(wword);

    /* Associate word string with d->n_word in hash table */
    if (hash_table_enter_int32(d->ht, wordp->word, d->n_word) != d->n_word) {
        ckd_free(wordp->word);
        wordp->word = NULL;
        return BAD_S3WID;
    }

    /* Fill in word entry, and set defaults */
    if (p && (np > 0)) {
        wordp->ciphone = (s3cipid_t *) ckd_malloc(np * sizeof(s3cipid_t));      /* Freed in dict_free */
        memcpy(wordp->ciphone, p, np * sizeof(s3cipid_t));
        wordp->pronlen = np;
    }
    else {
        wordp->ciphone = NULL;
        wordp->pronlen = 0;
    }

    newwid = d->n_word++;

    return newwid;
}